

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinimizeRecGroups.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_0::GroupClassInfo::permute(GroupClassInfo *this,RecGroupInfo *info)

{
  pointer pHVar1;
  pointer pHVar2;
  pointer puVar3;
  HeapType HVar4;
  uint uVar5;
  ulong uVar6;
  pointer pHVar7;
  bool bVar8;
  undefined1 local_60 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> canonical;
  allocator_type local_31;
  
  pHVar7 = (pointer)((long)(info->group).
                           super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(info->group).
                           super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 3);
  if (pHVar7 == (pointer)((long)(info->permutation).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(info->permutation).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 2)) {
    canonical.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)(((long)(this->subtypeGraph).
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->subtypeGraph).
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x18);
    bVar8 = pHVar7 < canonical.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_60,
               (long)&pHVar7->id + (ulong)bVar8,&local_31);
    pHVar1 = (info->group).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pHVar2 = (info->group).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    puVar3 = (info->permutation).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    for (uVar5 = 0; uVar6 = (ulong)uVar5, uVar6 < (ulong)((long)pHVar2 - (long)pHVar1 >> 3);
        uVar5 = uVar5 + 1) {
      ((pointer)((long)local_60 + (ulong)(puVar3[uVar6] + (uint)bVar8) * 8))->id = pHVar1[uVar6].id;
    }
    if ((this->brand).
        super__Optional_base<wasm::(anonymous_namespace)::BrandTypeIterator,_false,_false>.
        _M_payload.
        super__Optional_payload<wasm::(anonymous_namespace)::BrandTypeIterator,_true,_false,_false>.
        super__Optional_payload_base<wasm::(anonymous_namespace)::BrandTypeIterator>._M_engaged !=
        false) {
      HVar4 = BrandTypeIterator::operator*((BrandTypeIterator *)&this->brand);
      *(uintptr_t *)local_60 = HVar4.id;
    }
    if (pHVar7 < canonical.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::resize
                (&info->group,
                 ((long)(info->group).
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(info->group).
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) + 1);
      info->hasBrand = true;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (&info->permutation,&(this->orders).buf);
    pHVar7 = (info->group).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pHVar1 = (info->group).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    puVar3 = (info->permutation).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    for (uVar5 = 0; uVar6 = (ulong)uVar5, uVar6 < (ulong)((long)pHVar1 - (long)pHVar7 >> 3);
        uVar5 = uVar5 + 1) {
      pHVar7[uVar6].id = ((pointer)((long)local_60 + (ulong)puVar3[uVar6] * 8))->id;
    }
    std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
              ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_60);
    return;
  }
  __assert_fail("info.group.size() == info.permutation.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                ,0x121,"void wasm::(anonymous namespace)::GroupClassInfo::permute(RecGroupInfo &)");
}

Assistant:

void GroupClassInfo::permute(RecGroupInfo& info) {
  assert(info.group.size() == info.permutation.size());
  bool insertingBrand = info.group.size() < subtypeGraph.size();
  // First, un-permute the group to get back to the canonical order, offset by 1
  // if we are newly inserting a brand.
  std::vector<HeapType> canonical(info.group.size() + insertingBrand);
  for (Index i = 0; i < info.group.size(); ++i) {
    canonical[info.permutation[i] + insertingBrand] = info.group[i];
  }
  // Update the brand.
  if (brand) {
    canonical[0] = **brand;
  }
  if (insertingBrand) {
    info.group.resize(info.group.size() + 1);
    info.hasBrand = true;
  }
  // Finally, re-permute with the new permutation..
  info.permutation = *orders;
  for (Index i = 0; i < info.group.size(); ++i) {
    info.group[i] = canonical[info.permutation[i]];
  }
}